

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_getfield(lua_State *L,int idx,char *k)

{
  size_t l;
  TValue *i_o;
  TValue key;
  StkId t;
  char *k_local;
  int idx_local;
  lua_State *L_local;
  
  key._8_8_ = index2adr(L,idx);
  l = strlen(k);
  i_o = (TValue *)luaS_newlstr(L,k,l);
  key.value.b = 4;
  luaV_gettable(L,(TValue *)key._8_8_,(TValue *)&i_o,L->top);
  L->top = L->top + 1;
  return;
}

Assistant:

static void lua_getfield(lua_State*L,int idx,const char*k){
StkId t;
TValue key;
t=index2adr(L,idx);
api_checkvalidindex(L,t);
setsvalue(L,&key,luaS_new(L,k));
luaV_gettable(L,t,&key,L->top);
api_incr_top(L);
}